

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma_back.c
# Opt level: O3

_Bool parse_renouveau(state *s)

{
  uint32_t *puVar1;
  int iVar2;
  __ssize_t _Var3;
  ent e;
  ent local_3c;
  
  local_3c.addr = (s->parse).addr;
  local_3c.val = 0;
  local_3c.out_of_band = false;
  do {
    _Var3 = getline(&(s->parse).buf,&(s->parse).n,(FILE *)s->f);
    if (_Var3 < 0) goto LAB_001036ff;
    iVar2 = __isoc99_sscanf((s->parse).buf,"%x",&local_3c.val);
  } while (iVar2 != 1);
  add_ent(s,&local_3c);
  puVar1 = &(s->parse).addr;
  *puVar1 = *puVar1 + 4;
LAB_001036ff:
  return -1 < _Var3;
}

Assistant:

bool
parse_renouveau(struct state *s)
{
	struct ent e = {
		.addr = s->parse.addr
	};
	int ret;

	for (;;) {
		if (getline(&s->parse.buf, &s->parse.n, s->f) < 0)
			return false;

		ret = sscanf(s->parse.buf, "%x", &e.val);
		if (ret == 1)
			break;
	}

	add_ent(s, &e);
	s->parse.addr += 4;
	return true;
}